

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.h
# Opt level: O0

void __thiscall Coin::Clear(Coin *this)

{
  long lVar1;
  CTxOut *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CTxOut::SetNull(in_RDI);
  *(byte *)&in_RDI[1].nValue = (byte)in_RDI[1].nValue & 0xfe;
  *(uint *)&in_RDI[1].nValue = (uint)in_RDI[1].nValue & 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Clear() {
        out.SetNull();
        fCoinBase = false;
        nHeight = 0;
    }